

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::Group::Group(Group *this,string *help_,function<bool_(const_args::Group_&)> *validator_)

{
  Base *in_RDI;
  string *in_stack_ffffffffffffffc8;
  function<bool_(const_args::Group_&)> *in_stack_ffffffffffffffd8;
  function<bool_(const_args::Group_&)> *in_stack_ffffffffffffffe0;
  
  Base::Base(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Base = (_func_int **)&PTR__Group_0018b848;
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::vector
            ((vector<args::Base_*,_std::allocator<args::Base_*>_> *)0x118b83);
  std::function<bool_(const_args::Group_&)>::function
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

Group(const std::string &help_ = std::string(), const std::function<bool(const Group &)> &validator_ = Validators::DontCare) : Base(help_), validator(validator_) {}